

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GlGetAndPrintInteger(GLenum pname,char *name,int count)

{
  uint local_24;
  uint local_20;
  GLint params [2];
  int count_local;
  char *name_local;
  GLenum pname_local;
  
  params[0] = count;
  unique0x10000089 = name;
  memset(&local_24,0,8);
  glGetIntegerv(pname,&local_24);
  if (params[0] == 1) {
    aAppDebugPrintf("[agl] %s: %d",stack0xffffffffffffffe8,(ulong)local_24);
  }
  else if (params[0] == 2) {
    aAppDebugPrintf("[agl] %s: %d, %d",stack0xffffffffffffffe8,(ulong)local_24,(ulong)local_20);
  }
  return;
}

Assistant:

static void a__GlGetAndPrintInteger(GLenum pname, const char *name, int count) {
	GLint params[2] = {0};
	glGetIntegerv(pname, params);
	if (count == 1)
		AGL_PRINTFLN("%s: %d", name, params[0]);
	else if (count == 2)
		AGL_PRINTFLN("%s: %d, %d", name, params[0], params[1]);
}